

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

cargo_validation_t *
cargo_create_validator
          (char *name,cargo_validation_f validator,cargo_validation_destroy_f destroy,
          cargo_type_t types,void *user)

{
  cargo_validation_t *v;
  void *user_local;
  cargo_type_t types_local;
  cargo_validation_destroy_f destroy_local;
  cargo_validation_f validator_local;
  char *name_local;
  
  name_local = (char *)_cargo_calloc(1,0x30);
  if (name_local == (char *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    *(char **)name_local = name;
    *(cargo_validation_f *)(name_local + 8) = validator;
    *(cargo_validation_destroy_f *)(name_local + 0x10) = destroy;
    *(cargo_type_t *)(name_local + 0x18) = types;
    *(void **)(name_local + 0x28) = user;
  }
  return (cargo_validation_t *)name_local;
}

Assistant:

cargo_validation_t *cargo_create_validator(const char *name,
                                           cargo_validation_f validator,
                                           cargo_validation_destroy_f destroy,
                                           cargo_type_t types,
                                           void *user)
{
    cargo_validation_t *v = NULL;

    if (!(v = _cargo_calloc(1, sizeof(cargo_validation_t))))
    {
        return NULL;
    }

    v->name = name;
    v->validator = validator;
    v->destroy = destroy;
    v->types = types;
    v->user = user;

    return v;
}